

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-mltpctive-dynamical-system.cpp
# Opt level: O3

void __thiscall
stateObservation::IMUMltpctiveDynamicalSystem::stateSum
          (IMUMltpctiveDynamicalSystem *this,Vector *stateVector,Vector *tangentVector,Vector *sum)

{
  double *pdVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  PointerType ptr;
  double *pdVar8;
  undefined8 *puVar9;
  char *__function;
  ulong uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  
  if ((sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0x13
     ) {
    free((sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data);
    pdVar8 = (double *)malloc(0x98);
    if (((ulong)pdVar8 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar8 == (double *)0x0) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar9 = operator_delete;
      __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = pdVar8;
  }
  (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x13;
  if ((2 < (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows) &&
     (2 < (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows)) {
    pdVar8 = (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
             .m_data;
    pdVar1 = (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_data;
    pdVar2 = (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    dVar13 = pdVar8[1];
    dVar11 = pdVar1[1];
    *pdVar2 = *pdVar1 + *pdVar8;
    pdVar2[1] = dVar11 + dVar13;
    pdVar2[2] = pdVar8[2] + pdVar1[2];
    if ((9 < (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
             .m_rows) &&
       (8 < (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
            m_storage.m_rows)) {
      if ((sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
          10) {
LAB_0014a5fa:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_0014a63d;
      }
      pdVar8 = (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_data;
      pdVar1 = (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_data;
      pdVar2 = (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      dVar13 = pdVar8[8];
      dVar11 = pdVar1[7];
      pdVar2[7] = pdVar1[6] + pdVar8[7];
      pdVar2[8] = dVar11 + dVar13;
      pdVar2[9] = pdVar8[9] + pdVar1[8];
      if ((0xf < (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_rows) &&
         (0xe < (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows)) {
        if ((sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
            0x10) goto LAB_0014a5fa;
        pdVar8 = (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        pdVar1 = (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        pdVar2 = (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        dVar13 = pdVar8[0xe];
        dVar11 = pdVar1[0xd];
        pdVar2[0xd] = pdVar1[0xc] + pdVar8[0xd];
        pdVar2[0xe] = dVar11 + dVar13;
        pdVar2[0xf] = pdVar8[0xf] + pdVar1[0xe];
        if (5 < (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows) {
          pdVar8 = (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          dVar11 = *(double *)*(undefined1 (*) [16])(pdVar8 + 3);
          auVar14 = *(undefined1 (*) [16])(pdVar8 + 3);
          dVar13 = pdVar8[5];
          dVar16 = dVar13 * dVar13 + pdVar8[4] * pdVar8[4] + dVar11 * dVar11;
          dVar11 = SQRT(dVar16);
          uVar10 = -(ulong)(9.999999999999999e-33 < dVar16);
          dVar15 = (double)((ulong)(dVar11 * 0.5) & uVar10);
          dVar12 = cos(dVar15);
          dVar15 = sin(dVar15);
          if ((stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
              m_storage.m_rows < 7) {
            __function = 
            "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 4, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = false]"
            ;
            goto LAB_0014a63d;
          }
          if ((sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              < 7) {
            __function = 
            "Eigen::Block<Eigen::Matrix<double, -1, 1>, 4, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = false]"
            ;
            goto LAB_0014a63d;
          }
          pdVar8 = (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
          pdVar1 = (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          dVar4 = pdVar1[3];
          dVar5 = pdVar1[4];
          dVar6 = pdVar1[5];
          dVar7 = pdVar1[6];
          if (9.999999999999999e-33 < dVar16) {
            auVar3._8_8_ = dVar11;
            auVar3._0_8_ = dVar11;
            auVar14 = divpd(auVar14,auVar3);
            dVar16 = auVar14._0_8_;
            dVar17 = auVar14._8_8_;
          }
          else {
            dVar16 = 0.0;
            dVar17 = 0.0;
          }
          dVar16 = dVar15 * dVar16;
          dVar17 = dVar15 * dVar17;
          dVar15 = dVar15 * (double)(~uVar10 & 0x3ff0000000000000 |
                                    (ulong)(dVar13 / dVar11) & uVar10);
          dVar13 = dVar15 * dVar6 + dVar16 * dVar4;
          auVar18._8_4_ = SUB84(dVar13,0);
          auVar18._0_8_ = dVar15 * dVar7 + dVar16 * dVar5;
          auVar18._12_4_ = (int)((ulong)dVar13 >> 0x20);
          auVar18 = auVar18 ^ _DAT_001987d0;
          dVar13 = dVar15 * dVar4 - dVar16 * dVar6;
          auVar14._8_4_ = SUB84(dVar13,0);
          auVar14._0_8_ = dVar15 * dVar5 - dVar16 * dVar7;
          auVar14._12_4_ = (int)((ulong)dVar13 >> 0x20);
          auVar14 = auVar14 ^ _DAT_001987c0;
          pdVar8[3] = auVar14._0_8_ + dVar12 * dVar4 + dVar17 * dVar6;
          pdVar8[4] = auVar14._8_8_ + dVar12 * dVar5 + dVar17 * dVar7;
          pdVar8[5] = auVar18._0_8_ + (dVar12 * dVar6 - dVar17 * dVar4);
          pdVar8[6] = auVar18._8_8_ + (dVar12 * dVar7 - dVar17 * dVar5);
          if ((0xc < (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows) &&
             (0xb < (tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows)) {
            if (0xc < (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows) {
              pdVar8 = (stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                       .m_storage.m_data;
              pdVar1 = (tangentVector->
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                       m_data;
              pdVar2 = (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              dVar13 = pdVar8[0xb];
              dVar11 = pdVar1[10];
              pdVar2[10] = pdVar1[9] + pdVar8[10];
              pdVar2[0xb] = dVar11 + dVar13;
              pdVar2[0xc] = pdVar8[0xc] + pdVar1[0xb];
              if (((stateVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows < 0x13) ||
                 ((tangentVector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows < 0x12)) goto LAB_0014a5e3;
              if (0x12 < (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_rows) {
                pdVar8 = (stateVector->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                         m_data;
                pdVar1 = (tangentVector->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                         m_data;
                pdVar2 = (sum->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data;
                dVar13 = pdVar8[0x11];
                dVar11 = pdVar1[0x10];
                pdVar2[0x10] = pdVar1[0xf] + pdVar8[0x10];
                pdVar2[0x11] = dVar11 + dVar13;
                pdVar2[0x12] = pdVar8[0x12] + pdVar1[0x11];
                return;
              }
            }
            goto LAB_0014a5fa;
          }
        }
      }
    }
  }
LAB_0014a5e3:
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0014a63d:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void IMUMltpctiveDynamicalSystem::stateSum(const Vector & stateVector, const Vector & tangentVector, Vector & sum)
{
  sum.resize(indexes::size);
  sum.segment<3>(indexes::pos) = stateVector.segment<3>(indexes::pos) + tangentVector.segment<3>(indexesTangent::pos);
  sum.segment<3>(indexes::linVel) =
      stateVector.segment<3>(indexes::linVel) + tangentVector.segment<3>(indexesTangent::linVel);
  sum.segment<3>(indexes::linAcc) =
      stateVector.segment<3>(indexes::linAcc) + tangentVector.segment<3>(indexesTangent::linAcc);

  sum.segment<4>(indexes::ori) = (kine::rotationVectorToQuaternion(tangentVector.segment<3>(indexesTangent::ori))
                                  * Quaternion(stateVector.segment<4>(indexes::ori)))
                                     .coeffs();
  sum.segment<3>(indexes::angVel) =
      stateVector.segment<3>(indexes::angVel) + tangentVector.segment<3>(indexesTangent::angVel);
  sum.segment<3>(indexes::angAcc) =
      stateVector.segment<3>(indexes::angAcc) + tangentVector.segment<3>(indexesTangent::angAcc);
}